

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx::create_pipeline_int8_x86(InnerProduct_x86_avx *this,Option *opt)

{
  uint _h;
  int iVar1;
  Layer *pLVar2;
  _func_int **pp_Var3;
  int _w;
  long lVar4;
  void *pvVar5;
  _func_int *p_Var6;
  ulong uVar7;
  int j;
  size_t sVar8;
  int _elempack;
  size_t _elemsize;
  byte bVar9;
  ParamDict pd;
  Mat local_78;
  
  pp_Var3 = this->_vptr_InnerProduct_x86_avx;
  p_Var6 = pp_Var3[-3];
  switch(*(undefined4 *)(p_Var6 + 0x38 + (long)&(this->weight_data_int8).data)) {
  case 1:
    pLVar2 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&local_78);
    break;
  case 2:
    pLVar2 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,
                   **(float **)(p_Var6 + 0x40 + (long)&(this->weight_data_int8).data));
    (*pLVar2->_vptr_Layer[2])(pLVar2,&local_78);
    break;
  case 3:
    pLVar2 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,
                   **(float **)(p_Var6 + 0x40 + (long)&(this->weight_data_int8).data));
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)(*(long *)(p_Var6 + 0x40 + (long)&(this->weight_data_int8).data) + 4));
    (*pLVar2->_vptr_Layer[2])(pLVar2,&local_78);
    break;
  case 4:
    pLVar2 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&local_78);
    break;
  case 5:
    pLVar2 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&local_78);
    break;
  case 6:
    pLVar2 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,
                   **(float **)(p_Var6 + 0x40 + (long)&(this->weight_data_int8).data));
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)(*(long *)(p_Var6 + 0x40 + (long)&(this->weight_data_int8).data) + 4));
    (*pLVar2->_vptr_Layer[2])(pLVar2,&local_78);
    break;
  default:
    pLVar2 = (Layer *)0x0;
    goto LAB_001df3c7;
  }
  ParamDict::~ParamDict((ParamDict *)&local_78);
  (*pLVar2->_vptr_Layer[4])(pLVar2,opt);
  pp_Var3 = this->_vptr_InnerProduct_x86_avx;
LAB_001df3c7:
  this->activation = pLVar2;
  p_Var6 = pp_Var3[-3];
  _h = *(uint *)(p_Var6 + 0x28 + (long)&(this->weight_data_int8).data);
  iVar1 = *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_int8).data);
  bVar9 = (_h & 7) == 0 & opt->use_packing_layout;
  _elemsize = 1;
  if (bVar9 != 0) {
    _elemsize = 8;
  }
  _w = (int)((long)iVar1 / (long)(int)_h);
  Mat::reshape(&local_78,(Mat *)(p_Var6 + 0x40 + (long)&(this->scales_in).data),_w,_h,
               (Allocator *)0x0);
  _elempack = (int)_elemsize;
  Mat::create(&this->weight_data_int8,_w,
              *(int *)(this->_vptr_InnerProduct_x86_avx[-3] + 0x28 +
                      (long)&(this->weight_data_int8).data) / _elempack,_elemsize,_elempack,
              (Allocator *)0x0);
  pp_Var3 = this->_vptr_InnerProduct_x86_avx;
  p_Var6 = pp_Var3[-3];
  if (_elempack <= *(int *)(p_Var6 + 0x28 + (long)&(this->weight_data_int8).data)) {
    lVar4 = 0;
    do {
      if (0 < _w) {
        pvVar5 = (void *)((ulong)((uint)lVar4 >> bVar9 * '\x03') * (long)(this->weight_data_int8).w
                          * (this->weight_data_int8).elemsize + (long)(this->weight_data_int8).data)
        ;
        uVar7 = 0;
        do {
          sVar8 = 0;
          do {
            *(undefined1 *)((long)pvVar5 + sVar8) =
                 *(undefined1 *)
                  ((long)local_78.data +
                  uVar7 + (long)local_78.w * (lVar4 + sVar8) * local_78.elemsize);
            sVar8 = sVar8 + 1;
          } while (_elemsize != sVar8);
          uVar7 = uVar7 + 1;
          pvVar5 = (void *)((long)pvVar5 + sVar8);
        } while (uVar7 != ((long)iVar1 / (long)(int)_h & 0xffffffffU));
        p_Var6 = pp_Var3[-3];
      }
      lVar4 = lVar4 + _elemsize;
    } while ((long)(lVar4 + (ulong)(_elempack - 1)) <
             (long)*(int *)(p_Var6 + 0x28 + (long)&(this->weight_data_int8).data));
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_int8.create(num_input, num_output / out_elempack, (size_t)out_elempack, out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g0 = weight_data_int8.row<signed char>(q / out_elempack);

            for (int p = 0; p < num_input; p++)
            {
                for (int j = 0; j < out_elempack; j++)
                {
                    *g0++ = weight_data_r2.row<signed char>(q + j)[p];
                }
            }
        }
    }

    return 0;
}